

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

_Bool player_can_debug_prereq(void)

{
  _Bool _Var1;
  _Bool _Var2;
  
  _Var2 = true;
  if ((player->noscore & 8) == 0) {
    _Var1 = confirm_debug();
    if (_Var1) {
      player->noscore = player->noscore | 8;
    }
    else {
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

bool player_can_debug_prereq(void)
{
	if (player->noscore & NOSCORE_DEBUG) {
		return true;
	}
	if (confirm_debug()) {
		/* Mark savefile */
		player->noscore |= NOSCORE_DEBUG;
		return true;
	}
	return false;
}